

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopObj.c
# Opt level: O2

Hop_Obj_t * Hop_ObjCreate(Hop_Man_t *p,Hop_Obj_t *pGhost)

{
  uint __line;
  Hop_Obj_t *pObj;
  char *__assertion;
  
  if (((ulong)pGhost & 1) == 0) {
    if ((*(uint *)&pGhost->field_0x20 & 6) == 4) {
      if (&p->Ghost == pGhost) {
        pObj = Hop_ManFetchMemory(p);
        *(uint *)&pObj->field_0x20 =
             *(uint *)&pObj->field_0x20 & 0xfffffff8 | *(uint *)&pGhost->field_0x20 & 7;
        Hop_ObjConnect(p,pObj,pGhost->pFanin0,pGhost->pFanin1);
        p->nObjs[*(uint *)&pObj->field_0x20 & 7] = p->nObjs[*(uint *)&pObj->field_0x20 & 7] + 1;
        if ((pObj->field_0).pData == (void *)0x0) {
          return pObj;
        }
        __assertion = "pObj->pData == NULL";
        __line = 0x6e;
      }
      else {
        __assertion = "pGhost == &p->Ghost";
        __line = 0x66;
      }
    }
    else {
      __assertion = "Hop_ObjIsNode(pGhost)";
      __line = 0x65;
    }
  }
  else {
    __assertion = "!Hop_IsComplement(pGhost)";
    __line = 100;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopObj.c"
                ,__line,"Hop_Obj_t *Hop_ObjCreate(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

Hop_Obj_t * Hop_ObjCreate( Hop_Man_t * p, Hop_Obj_t * pGhost )
{
    Hop_Obj_t * pObj;
    assert( !Hop_IsComplement(pGhost) );
    assert( Hop_ObjIsNode(pGhost) );
    assert( pGhost == &p->Ghost );
    // get memory for the new object
    pObj = Hop_ManFetchMemory( p );
    pObj->Type = pGhost->Type;
    // add connections
    Hop_ObjConnect( p, pObj, pGhost->pFanin0, pGhost->pFanin1 );
    // update node counters of the manager
    p->nObjs[Hop_ObjType(pObj)]++;
    assert( pObj->pData == NULL );
    return pObj;
}